

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_iter(void)

{
  uint uVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  int __fd;
  undefined8 uVar5;
  long lVar6;
  bson_iter_t *pbVar7;
  long lVar8;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar9;
  ulong uVar10;
  bool bVar11;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t *bcon;
  bson_t *other;
  bson_iter_t iter;
  int local_180;
  uint local_13c;
  uint local_138;
  bson_iter_t local_100 [3];
  
  uVar5 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(10);
  lVar6 = bcon_new(0,"foo",uVar5,0xf,iVar3);
  uVar5 = bson_bcone_magic();
  pbVar7 = bcon_ensure_bson_iter_ptr(local_100);
  bVar2 = bcon_extract(lVar6,"foo",uVar5,0x1d,pbVar7,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1dc,"test_iter","BCON_EXTRACT (bcon, \"foo\", BCONE_ITER (iter))");
    abort();
  }
  iVar4 = bson_iter_type(local_100);
  if (iVar4 != 0x10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1de,"test_iter","bson_iter_type (&iter) == BSON_TYPE_INT32");
    abort();
  }
  iVar4 = bson_iter_int32(local_100);
  if (iVar4 != 10) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1df,"test_iter","bson_iter_int32 (&iter) == 10");
    abort();
  }
  uVar5 = bson_bcon_magic();
  pbVar7 = bcon_ensure_const_bson_iter_ptr(local_100);
  lVar8 = bcon_new(0,"foo",uVar5,0x1d,pbVar7);
  __buf = (void *)bson_get_data(lVar8);
  __buf_00 = (void *)bson_get_data(lVar6);
  local_13c = 0xffffffff;
  bVar11 = true;
  if (*(int *)(lVar6 + 4) == *(int *)(lVar8 + 4)) {
    __s1 = (void *)bson_get_data(lVar6);
    __s2 = (void *)bson_get_data(lVar8);
    iVar4 = memcmp(__s1,__s2,(ulong)*(uint *)(lVar6 + 4));
    bVar11 = iVar4 != 0;
  }
  if (!bVar11) {
    bson_destroy(lVar6);
    bson_destroy(lVar8);
    return;
  }
  uVar5 = bson_as_canonical_extended_json(lVar8,0);
  uVar9 = bson_as_canonical_extended_json(lVar6,0);
  local_138 = 0;
  while( true ) {
    bVar11 = false;
    if (local_138 < *(uint *)(lVar8 + 4)) {
      bVar11 = local_138 < *(uint *)(lVar6 + 4);
    }
    if (!bVar11) goto LAB_0014a1f1;
    if (*(char *)((long)__buf + (ulong)local_138) != *(char *)((long)__buf_00 + (ulong)local_138))
    break;
    local_138 = local_138 + 1;
  }
  local_13c = local_138;
LAB_0014a1f1:
  if (local_13c == 0xffffffff) {
    if (*(uint *)(lVar8 + 4) < *(uint *)(lVar6 + 4)) {
      local_180 = *(int *)(lVar6 + 4);
    }
    else {
      local_180 = *(int *)(lVar8 + 4);
    }
    local_13c = local_180 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_13c,uVar5,uVar9);
  iVar4 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar4 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1e3,"test_iter","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1e3,"test_iter","fd2 != -1");
    abort();
  }
  uVar1 = *(uint *)(lVar8 + 4);
  uVar10 = write(iVar4,__buf,(ulong)*(uint *)(lVar8 + 4));
  if (uVar1 == uVar10) {
    uVar1 = *(uint *)(lVar6 + 4);
    uVar10 = write(__fd,__buf_00,(ulong)*(uint *)(lVar6 + 4));
    if (uVar1 == uVar10) {
      close(iVar4);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
              ,0x1e3,"test_iter","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x1e3,"test_iter","(bcon)->len == bson_write (fd2, expected_data, (bcon)->len)");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,0x1e3,"test_iter","(other)->len == bson_write (fd1, bson_data, (other)->len)");
  abort();
}

Assistant:

static void
test_iter (void)
{
   bson_t bcon, expected;
   bson_iter_t iter;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_int32 (&expected, "foo", -1, 100);
   bson_iter_init_find (&iter, &expected, "foo");

   BCON_APPEND (&bcon, "foo", BCON_ITER (&iter));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}